

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_json_parser.h
# Opt level: O0

size_t fio_json_parse(json_parser_s *parser,char *buffer,size_t length)

{
  uint8_t *puVar1;
  int iVar2;
  int64_t i_00;
  void *pvVar3;
  bool bVar4;
  double f_00;
  uint8_t *tmp_4;
  uint8_t *tmp_3;
  uint8_t *tmp_2;
  double f;
  longlong i;
  uint8_t *tmp_1;
  uint8_t *key;
  uint8_t *tmp;
  uint8_t *limit;
  uint8_t *pos;
  size_t length_local;
  char *buffer_local;
  json_parser_s *parser_local;
  
  if ((length == 0) || (buffer == (char *)0x0)) {
    return 0;
  }
  tmp = (uint8_t *)(buffer + length);
  limit = (uint8_t *)buffer;
  buffer_local = (char *)parser;
  length_local = (size_t)buffer;
  pos = (uint8_t *)length;
  do {
    while( true ) {
      bVar4 = false;
      if (limit < tmp) {
        bVar4 = ""[*limit] != '\0';
      }
      if (!bVar4) break;
      limit = limit + 1;
    }
    if (limit == tmp) goto LAB_0018c30a;
    switch(*limit) {
    case '\"':
      key = limit + 1;
      iVar2 = seek2eos(&key,tmp);
      if (iVar2 != 0) {
        puVar1 = key;
        if (buffer_local[5] == '\0') {
          limit = limit + 1;
          fio_json_on_string((json_parser_s *)buffer_local,limit,(long)key - (long)limit);
          limit = key + 1;
          break;
        }
        do {
          tmp_1 = puVar1 + 1;
          bVar4 = false;
          if (tmp_1 < tmp) {
            bVar4 = ""[*tmp_1] != '\0';
          }
          puVar1 = tmp_1;
        } while (bVar4);
        if (tmp_1 < tmp) {
          if (*tmp_1 != ':') goto LAB_0018c31b;
          limit = limit + 1;
          fio_json_on_string((json_parser_s *)buffer_local,limit,(long)key - (long)limit);
          limit = tmp_1 + 1;
          buffer_local[5] = '\0';
          goto LAB_0018c2fa;
        }
      }
      goto LAB_0018c30a;
    case '#':
      pvVar3 = memchr(limit,10,(long)tmp - (long)limit);
      if (pvVar3 != (void *)0x0) {
        limit = (uint8_t *)((long)pvVar3 + 1);
        goto LAB_0018c2fa;
      }
      goto LAB_0018c30a;
    default:
      goto LAB_0018c31b;
    case '-':
    case '.':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 'E':
    case 'I':
    case 'e':
    case 'i':
    case 'x':
LAB_0018c0f9:
      i = (longlong)limit;
      i_00 = fio_atol((char **)&i);
      if (tmp < (ulong)i) goto LAB_0018c30a;
      if ((i == 0) || (""[*(byte *)i] != '\0')) {
        i = (longlong)limit;
        f_00 = fio_atof((char **)&i);
        if (tmp < (ulong)i) goto LAB_0018c30a;
        if ((i == 0) || (""[*(byte *)i] != '\0')) goto LAB_0018c31b;
        fio_json_on_float((json_parser_s *)buffer_local,f_00);
        limit = (uint8_t *)i;
      }
      else {
        fio_json_on_number((json_parser_s *)buffer_local,i_00);
        limit = (uint8_t *)i;
      }
      break;
    case '/':
      if (limit[1] == '*') {
        if (tmp < limit + 4) goto LAB_0018c30a;
        tmp_4 = limit + 3;
        do {
          tmp_4 = (uint8_t *)memchr(tmp_4,0x2f,(long)tmp - (long)tmp_4);
          bVar4 = false;
          if (tmp_4 != (uint8_t *)0x0) {
            bVar4 = tmp_4[-1] != '*';
          }
        } while (bVar4);
      }
      else {
        if (limit[1] != '/') goto LAB_0018c31b;
        tmp_4 = (uint8_t *)memchr(limit,10,(long)tmp - (long)limit);
      }
      if (tmp_4 != (uint8_t *)0x0) {
        limit = tmp_4 + 1;
        goto LAB_0018c2fa;
      }
      goto LAB_0018c30a;
    case 'N':
    case 'n':
      if (((limit + 2 <= tmp) && ((limit[1] | 0x20) == 0x61)) && ((limit[2] | 0x20) == 0x6e))
      goto LAB_0018c0f9;
      if (tmp <= limit + 3) goto LAB_0018c30a;
      if (((limit[1] != 'u') || (limit[2] != 'l')) || (limit[3] != 'l')) goto LAB_0018c31b;
      fio_json_on_null((json_parser_s *)buffer_local);
      limit = limit + 4;
      break;
    case '[':
      if ((buffer_local[5] != '\0') ||
         (buffer_local[4] = buffer_local[4] + '\x01', 0x1f < (byte)buffer_local[4]))
      goto LAB_0018c31b;
      limit = limit + 1;
      *(int *)buffer_local = *(int *)buffer_local << 1;
      iVar2 = fio_json_on_start_array((json_parser_s *)buffer_local);
      goto joined_r0x0018be89;
    case ']':
      if ((*(uint *)buffer_local & 1) != 0) goto LAB_0018c31b;
      buffer_local[4] = buffer_local[4] + -1;
      limit = limit + 1;
      *(uint *)buffer_local = *(uint *)buffer_local >> 1;
      fio_json_on_end_array((json_parser_s *)buffer_local);
      break;
    case 'f':
      if (tmp <= limit + 4) goto LAB_0018c30a;
      if (((tmp <= limit + 4) || (limit[1] != 'a')) ||
         ((limit[2] != 'l' || ((limit[3] != 's' || (limit[4] != 'e')))))) goto LAB_0018c31b;
      fio_json_on_false((json_parser_s *)buffer_local);
      limit = limit + 5;
      break;
    case 't':
      if (tmp <= limit + 3) goto LAB_0018c30a;
      if (((limit[1] != 'r') || (limit[2] != 'u')) || (limit[3] != 'e')) goto LAB_0018c31b;
      fio_json_on_true((json_parser_s *)buffer_local);
      limit = limit + 4;
      break;
    case '{':
      if ((buffer_local[5] != '\0') ||
         (buffer_local[4] = buffer_local[4] + '\x01', 0x1f < (byte)buffer_local[4]))
      goto LAB_0018c31b;
      *(uint *)buffer_local = *(int *)buffer_local << 1 | 1;
      limit = limit + 1;
      iVar2 = fio_json_on_start_object((json_parser_s *)buffer_local);
joined_r0x0018be89:
      if (iVar2 != 0) {
LAB_0018c31b:
        fio_json_on_error((json_parser_s *)buffer_local);
        return 0;
      }
      break;
    case '}':
      if ((*(uint *)buffer_local & 1) == 0) goto LAB_0018c31b;
      if (buffer_local[5] == '\0') {
        fio_json_on_null((json_parser_s *)buffer_local);
      }
      buffer_local[4] = buffer_local[4] + -1;
      limit = limit + 1;
      *(uint *)buffer_local = *(uint *)buffer_local >> 1;
      fio_json_on_end_object((json_parser_s *)buffer_local);
    }
    if (buffer_local[4] == '\0') {
      fio_json_on_json((json_parser_s *)buffer_local);
      goto LAB_0018c30a;
    }
    buffer_local[5] = (byte)*(undefined4 *)buffer_local & 1;
LAB_0018c2fa:
    if (tmp <= limit) {
LAB_0018c30a:
      return (size_t)(limit + -length_local);
    }
  } while( true );
}

Assistant:

static size_t __attribute__((unused))
fio_json_parse(json_parser_s *parser, const char *buffer, size_t length) {
  if (!length || !buffer)
    return 0;
  uint8_t *pos = (uint8_t *)buffer;
  const uint8_t *limit = pos + length;
  do {
    while (pos < limit && JSON_SEPERATOR[*pos])
      ++pos;
    if (pos == limit)
      goto stop;
    switch (*pos) {
    case '"': {
      uint8_t *tmp = pos + 1;
      if (seek2eos(&tmp, limit) == 0)
        goto stop;
      if (parser->key) {
        uint8_t *key = tmp + 1;
        while (key < limit && JSON_SEPERATOR[*key])
          ++key;
        if (key >= limit)
          goto stop;
        if (*key != ':')
          goto error;
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = key + 1;
        parser->key = 0;
        continue; /* skip tests */
      } else {
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = tmp + 1;
      }
      break;
    }
    case '{':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be a Hash.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      parser->dict = (parser->dict << 1) | 1;
      ++pos;
      if (fio_json_on_start_object(parser))
        goto error;
      break;
    case '}':
      if ((parser->dict & 1) == 0) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure error.\n");
#endif
        goto error;
      }
      if (!parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure missing key value.\n");
        goto error;
#endif
        fio_json_on_null(parser); /* append NULL and recuperate from error. */
      }
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_object(parser);
      break;
    case '[':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be an array.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      ++pos;
      parser->dict = (parser->dict << 1);
      if (fio_json_on_start_array(parser))
        goto error;
      break;
    case ']':
      if ((parser->dict & 1))
        goto error;
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_array(parser);
      break;
    case 't':
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'r' && pos[2] == 'u' && pos[3] == 'e')
        fio_json_on_true(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'N': /* overflow */
    case 'n':
      if (pos + 2 <= limit && (pos[1] | 32) == 'a' && (pos[2] | 32) == 'n')
        goto numeral;
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'u' && pos[2] == 'l' && pos[3] == 'l')
        fio_json_on_null(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'f':
      if (pos + 4 >= limit)
        goto stop;
      if (pos + 4 < limit && pos[1] == 'a' && pos[2] == 'l' && pos[3] == 's' &&
          pos[4] == 'e')
        fio_json_on_false(parser);
      else
        goto error;
      pos += 5;
      break;
    case '-': /* overflow */
    case '0': /* overflow */
    case '1': /* overflow */
    case '2': /* overflow */
    case '3': /* overflow */
    case '4': /* overflow */
    case '5': /* overflow */
    case '6': /* overflow */
    case '7': /* overflow */
    case '8': /* overflow */
    case '9': /* overflow */
    case '.': /* overflow */
    case 'e': /* overflow */
    case 'E': /* overflow */
    case 'x': /* overflow */
    case 'i': /* overflow */
    case 'I': /* overflow */
    numeral : {
      uint8_t *tmp = pos;
      long long i = fio_atol((char **)&tmp);
      if (tmp > limit)
        goto stop;
      if (!tmp || JSON_NUMERAL[*tmp]) {
        tmp = pos;
        double f = fio_atof((char **)&tmp);
        if (tmp > limit)
          goto stop;
        if (!tmp || JSON_NUMERAL[*tmp])
          goto error;
        fio_json_on_float(parser, f);
        pos = tmp;
      } else {
        fio_json_on_number(parser, i);
        pos = tmp;
      }
      break;
    }
    case '#': /* Ruby style comment */
    {
      uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
      if (!tmp)
        goto stop;
      pos = tmp + 1;
      continue; /* skip tests */
      ;
    }
    case '/': /* C style / Javascript style comment */
      if (pos[1] == '*') {
        if (pos + 4 > limit)
          goto stop;
        uint8_t *tmp = pos + 3; /* avoid this: /*/
        do {
          tmp = memchr(tmp, '/', (uintptr_t)(limit - tmp));
        } while (tmp && tmp[-1] != '*');
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else if (pos[1] == '/') {
        uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else
        goto error;
      continue; /* skip tests */
      ;
    default:
      goto error;
    }
    if (parser->depth == 0) {
      fio_json_on_json(parser);
      goto stop;
    }
    parser->key = (parser->dict & 1);
  } while (pos < limit);
stop:
  return (size_t)((uintptr_t)pos - (uintptr_t)buffer);
error:
  fio_json_on_error(parser);
  return 0;
}